

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O1

void on_mouse(int event,int x,int y,int flags,void *param_5)

{
  char cVar1;
  
  cVar1 = cv::Mat::empty();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: on_mouse(): frame image is unloaded",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    return;
  }
  if (event == 1) {
    C2dPtSel::addNd(&o2dPtSel,x,y);
    return;
  }
  return;
}

Assistant:

void on_mouse(int event, int x, int y, int flags, void*)  // mouse event
{
	if (!o2dPtSel.chkImgLd())
	{
		std::cout << "Error: on_mouse(): frame image is unloaded" << std::endl;
		return;
	}

	if (event == cv::EVENT_FLAG_LBUTTON)
		o2dPtSel.addNd(x, y);

	return;
}